

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vec4f * __thiscall
Shader::vertex(vec4f *__return_storage_ptr__,Shader *this,Model *model,int iface,int nthvert)

{
  size_t nthvert_00;
  vec3f vStack_168;
  vec<4UL,_double> local_150;
  mat<4UL,_4UL> local_130;
  mat<4UL,_4UL> local_b0;
  
  nthvert_00 = (size_t)nthvert;
  local_130.rows[0].data._0_16_ = Model::uv(model,(long)iface,nthvert_00);
  mat<2UL,_3UL>::set_col(&this->varying_uv,nthvert_00,(vec<2UL,_double> *)&local_130);
  operator*(&local_b0,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_130,&local_b0,&(this->super_IShader).uniform_ModelView);
  Model::vert(&vStack_168,model,(long)iface,nthvert_00);
  embed<4ul,3ul,double>(&local_150,&vStack_168,1.0);
  operator*(__return_storage_ptr__,&local_130,&local_150);
  operator/(local_130.rows,__return_storage_ptr__,__return_storage_ptr__->data + 3);
  proj<3ul,4ul,double>((vec<3UL,_double> *)&local_b0,local_130.rows);
  mat<3UL,_3UL>::set_col(&this->varying_tri,nthvert_00,(vec<3UL,_double> *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        varying_uv.set_col(nthvert, model.uv(iface, nthvert));
        vec4f gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                          embed<4>(model.vert(iface, nthvert));
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }